

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  IRRef1 IVar1;
  uint uVar2;
  TRef TVar3;
  int iVar4;
  TRef TVar5;
  int iVar6;
  int32_t iVar7;
  TValue *pTVar8;
  long lVar9;
  TRef local_1d0;
  TRef local_1cc;
  TRef vbase_1;
  TRef aref;
  IRType t_1;
  TRef tmp2;
  TRef tmp_1;
  TRef tmp;
  ptrdiff_t idx;
  TRef tr;
  TRef tridx;
  IRType t;
  TRef vbase;
  ptrdiff_t nload;
  ptrdiff_t i_1;
  int32_t frofs;
  TRef fr;
  ptrdiff_t i;
  ptrdiff_t nvararg;
  ptrdiff_t pStack_168;
  int32_t numparams;
  ptrdiff_t nresults_local;
  BCReg dst_local;
  jit_State *J_local;
  IRType local_24;
  IRType local_18;
  
  uVar2 = (uint)J->pt->numparams;
  i = ((J->L->base[-1].it64 >> 3) - (long)(int)uVar2) + -2;
  if (J->maxslot < dst) {
    J->base[dst - 1] = 0;
  }
  iVar6 = (int)nresults;
  if (J->framedepth < 1) {
    (J->fold).ins.field_0.ot = 0x4713;
    (J->fold).ins.field_0.op1 = 1;
    (J->fold).ins.field_0.op2 = 0x12;
    TVar3 = lj_opt_fold(J);
    iVar4 = (uVar2 + 2) * 8;
    i_1._0_4_ = iVar4 + 3;
    IVar1 = (IRRef1)TVar3;
    if (nresults < 0) {
      iVar6 = select_detect(J);
      if (iVar6 != 0) {
        idx._4_4_ = J->base[dst - 1];
        idx._0_4_ = 0x7fff;
        iVar7 = lj_ffrecord_select_mode(J,idx._4_4_,J->L->base + (dst - 1));
        lVar9 = (long)iVar7;
        if (-1 < lVar9) {
          if ((lVar9 != 0) && (4 < (idx._4_4_ >> 0x18 & 0x1f) - 0xf)) {
            (J->fold).ins.field_0.ot = 0x5b93;
            (J->fold).ins.field_0.op1 = (IRRef1)idx._4_4_;
            (J->fold).ins.field_0.op2 = 0x226e;
            idx._4_4_ = lj_opt_fold(J);
          }
          if ((lVar9 == 0) || (0x7fff < (idx._4_4_ & 0xffff))) {
            if (i < lVar9) {
              TVar3 = lj_ir_kint(J,(int)i_1);
              t_1._0_2_ = (undefined2)TVar3;
              if (lVar9 == 0) {
                idx._0_4_ = lj_ir_kint(J,0);
              }
              else {
                TVar3 = lj_ir_kint(J,3);
                (J->fold).ins.field_0.ot = 0x2413;
                (J->fold).ins.field_0.op1 = idx._4_2_;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
                TVar3 = lj_opt_fold(J);
                (J->fold).ins.field_0.ot = 0x2913;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
                (J->fold).ins.field_0.op2 = (undefined2)t_1;
                TVar3 = lj_opt_fold(J);
                t_1._0_2_ = (undefined2)TVar3;
              }
              (J->fold).ins.field_0.ot = 0x93;
              (J->fold).ins.field_0.op1 = IVar1;
              (J->fold).ins.field_0.op2 = (undefined2)t_1;
              lj_opt_fold(J);
            }
            else {
              TVar3 = lj_ir_kint(J,-(int)i_1);
              (J->fold).ins.field_0.ot = 0x2913;
              (J->fold).ins.field_0.op1 = IVar1;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
              TVar3 = lj_opt_fold(J);
              if (uVar2 != 0) {
                TVar5 = lj_ir_kint(J,0);
                (J->fold).ins.field_0.ot = 0x193;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
                lj_opt_fold(J);
              }
              TVar5 = lj_ir_kint(J,3);
              (J->fold).ins.field_0.ot = 0x2513;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
              idx._0_4_ = lj_opt_fold(J);
              if (lVar9 != 0) {
                TVar3 = lj_ir_kint(J,-1);
                (J->fold).ins.field_0.ot = 0x2913;
                (J->fold).ins.field_0.op1 = idx._4_2_;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
                idx._4_4_ = lj_opt_fold(J);
                rec_idx_abc(J,(TRef)idx,idx._4_4_,(uint32_t)i);
              }
            }
          }
          else {
            TVar3 = lj_ir_kint(J,(int)i_1 + iVar7 * 8);
            (J->fold).ins.field_0.ot = (ushort)(lVar9 <= i) << 8 | 0x93;
            (J->fold).ins.field_0.op1 = IVar1;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
            lj_opt_fold(J);
            i_1._0_4_ = iVar4 + -5;
          }
          if ((lVar9 != 0) && (lVar9 <= i)) {
            (J->fold).ins.field_0.ot = 0x2a15;
            (J->fold).ins.field_0.op1 = 0x8000;
            (J->fold).ins.field_0.op2 = IVar1;
            TVar3 = lj_opt_fold(J);
            TVar5 = lj_ir_kint(J,(int)i_1 + -0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
            TVar3 = lj_opt_fold(J);
            pTVar8 = J->L->base + ((lVar9 + -3) - i);
            if ((uint)((int)(pTVar8->field_4).it >> 0xf) < 0xfffffff2) {
              local_24 = IRT_NUM;
            }
            else {
              local_24 = (int)(pTVar8->field_4).it >> 0xf ^ ~IRT_NIL;
            }
            (J->fold).ins.field_0.ot = 0x3809;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
            (J->fold).ins.field_0.op2 = idx._4_2_;
            TVar3 = lj_opt_fold(J);
            idx._0_4_ = lj_record_vload(J,TVar3,0,local_24);
          }
          J->base[dst - 3] = (TRef)idx;
          J->maxslot = dst - 2;
          J->bcskip = '\x02';
          goto LAB_0015f723;
        }
      }
      (J->errinfo).u64 = 0x4051c00000000000;
      lj_trace_err_info(J,LJ_TRERR_NYIBC);
    }
    if (i < 1) {
      TVar3 = lj_ir_kint(J,(int)i_1);
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      lj_opt_fold(J);
      i = 0;
    }
    else {
      if (i < nresults) {
        TVar3 = lj_ir_kint(J,J->L->base[-1].field_4.i);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = IVar1;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        lj_opt_fold(J);
        lVar9 = i;
      }
      else {
        TVar3 = lj_ir_kint(J,(int)i_1 + iVar6 * 8);
        (J->fold).ins.field_0.ot = 0x193;
        (J->fold).ins.field_0.op1 = IVar1;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        lj_opt_fold(J);
        lVar9 = nresults;
      }
      (J->fold).ins.field_0.ot = 0x2a15;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar1;
      TVar3 = lj_opt_fold(J);
      TVar5 = lj_ir_kint(J,iVar4 + -5);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar3 = lj_opt_fold(J);
      for (nload = 0; nload < lVar9; nload = nload + 1) {
        pTVar8 = J->L->base + ((nload + -2) - i);
        if ((uint)((int)(pTVar8->field_4).it >> 0xf) < 0xfffffff2) {
          local_18 = IRT_NUM;
        }
        else {
          local_18 = (int)(pTVar8->field_4).it >> 0xf ^ ~IRT_NIL;
        }
        TVar5 = lj_record_vload(J,TVar3,(MSize)nload,local_18);
        J->base[(ulong)dst + nload] = TVar5;
      }
    }
    for (nload = i; nload < nresults; nload = nload + 1) {
      J->base[(ulong)dst + nload] = 0x7fff;
    }
    if (J->maxslot < dst + iVar6) {
      J->maxslot = dst + iVar6;
    }
  }
  else {
    if (i < 0) {
      i = 0;
    }
    if (nresults == -1) {
      pStack_168 = i;
      J->maxslot = dst + (int)i;
    }
    else {
      pStack_168 = nresults;
      if ((long)(ulong)J->maxslot < (long)((ulong)dst + nresults)) {
        J->maxslot = dst + iVar6;
      }
    }
    for (_frofs = 0; _frofs < pStack_168; _frofs = _frofs + 1) {
      if (_frofs < i) {
        if (J->base[(_frofs - i) + -2] == 0) {
          local_1cc = sload(J,((int)_frofs - (int)i) + -2);
        }
        else {
          local_1cc = J->base[(_frofs - i) + -2];
        }
        local_1d0 = local_1cc;
      }
      else {
        local_1d0 = 0x7fff;
      }
      J->base[(ulong)dst + _frofs] = local_1d0;
    }
  }
LAB_0015f723:
  if (J->baseslot + J->maxslot < 0xfa) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1 - LJ_FR2;
  lj_assertJ(frame_isvarg(J->L->base-1), "VARG in non-vararg frame");
  if (LJ_FR2 && dst > J->maxslot)
    J->base[dst-1] = 0;  /* Prevent resurrection of unrelated slot. */
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults == -1) {
      nresults = nvararg;
      J->maxslot = dst + (BCReg)nvararg;
    } else if (dst + nresults > J->maxslot) {
      J->maxslot = dst + (BCReg)nresults;
    }
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1 - LJ_FR2) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), LJ_FR2, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+LJ_FR2+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr,
		 lj_ir_kint(J, (int32_t)frame_ftsz(J->L->base-1)));
	vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase, lj_ir_kint(J, frofs-8));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-LJ_FR2-nvararg]);
	  J->base[dst+i] = lj_record_vload(J, vbase, i, t);
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (dst + (BCReg)nresults > J->maxslot)
	J->maxslot = dst + (BCReg)nresults;
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = J->base[dst-1];
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx))
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase,
		       lj_ir_kint(J, frofs-(8<<LJ_FR2)));
	t = itype2irt(&J->L->base[idx-2-LJ_FR2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_PGC), vbase, tridx);
	tr = lj_record_vload(J, aref, 0, t);
      }
      J->base[dst-2-LJ_FR2] = tr;
      J->maxslot = dst-1-LJ_FR2;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
  if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
}